

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
ReconnectIRCCommand::trigger
          (ReconnectIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view param_4)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  ushort uVar4;
  DisconnectReason DVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  char *pcVar9;
  size_t sVar10;
  uint uVar11;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar9 = channel._M_str;
  sVar10 = channel._M_len;
  lVar6 = Jupiter::IRC::Client::getChannel(source,sVar10,pcVar9,pcVar9,nick._M_len,nick._M_str);
  if (lVar6 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    uVar11 = 0;
    while( true ) {
      RenX::getCore();
      uVar7 = RenX::Core::getServerCount();
      if (uVar7 == uVar11) break;
      uVar7 = RenX::getCore();
      DVar5 = RenX::Core::getServer(uVar7);
      cVar3 = RenX::Server::isLogChanType(DVar5);
      if (cVar3 != '\0') {
        cVar3 = RenX::Server::reconnect(DVar5);
        if (cVar3 == '\0') {
          lVar6 = RenX::Server::getHostname_abi_cxx11_();
          uVar1 = *(undefined8 *)(lVar6 + 8);
          puVar8 = (undefined8 *)RenX::Server::getHostname_abi_cxx11_();
          uVar2 = *puVar8;
          uVar4 = RenX::Server::getPort();
          string_printf_abi_cxx11_
                    (&local_50,"[RenX] ERROR: Failed to connect to %.*s on port %u.\r\n",uVar1,uVar2
                     ,(ulong)uVar4);
        }
        else {
          s_abi_cxx11_(&local_50,"Connection established",0x16);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&msg,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        Jupiter::IRC::Client::sendMessage
                  (source,sVar10,pcVar9,msg._M_string_length,msg._M_dataplus._M_p);
      }
      uVar11 = uVar11 + 1;
    }
    if (msg._M_string_length == 0) {
      s_abi_cxx11_(&local_50,"ERROR: No servers found to connect to.",0x26);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&msg,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      Jupiter::IRC::Client::sendMessage
                (source,sVar10,pcVar9,msg._M_string_length,msg._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void ReconnectIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view ) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		std::string msg;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type)) {
				if (server->reconnect(RenX::DisconnectReason::Triggered)) {
					msg = "Connection established"s;
				}
				else {
					msg = string_printf("[RenX] ERROR: Failed to connect to %.*s on port %u." ENDL, server->getHostname().size(), server->getHostname().c_str(), server->getPort());
				}
				source->sendMessage(channel, msg);
			}
		}
		if (msg.empty()) {
			// We didn't connect anywhere!!
			msg = "ERROR: No servers found to connect to."s;
			source->sendMessage(channel, msg);
		}
	}
}